

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::IFF_Layer2::Encode(IFF_Layer2 *this,KDataStream *stream)

{
  pointer pIVar1;
  pointer pIVar2;
  
  LayerHeader::Encode(&this->super_LayerHeader,stream);
  (*(this->m_BmDt).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_BmDt,stream);
  (*(this->m_SOD).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_SOD,stream);
  pIVar1 = (this->m_vFPD).
           super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar2 = (this->m_vFPD).
                super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar2 != pIVar1; pIVar2 = pIVar2 + 1) {
    (*(pIVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pIVar2,stream);
  }
  return;
}

Assistant:

void IFF_Layer2::Encode( KDataStream & stream ) const
{
	LayerHeader::Encode( stream );

    stream << KDIS_STREAM m_BmDt
           << KDIS_STREAM m_SOD;

    vector<IFF_ATC_NAVAIDS_FundamentalParameterData>::const_iterator citr = m_vFPD.begin();
    vector<IFF_ATC_NAVAIDS_FundamentalParameterData>::const_iterator citrEnd = m_vFPD.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}